

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O2

bool __thiscall Flatten::inlineFunction(Flatten *this,Function *F,Function *Caller)

{
  uint uVar1;
  BasicBlock *pBVar2;
  pointer ppCVar3;
  pointer Func;
  pointer ppVVar4;
  char cVar5;
  bool bVar6;
  Function *pFVar7;
  LLVMContext *pLVar8;
  Twine *NameStr;
  Instruction *pIVar9;
  mapped_type pBVar10;
  mapped_type *ppBVar11;
  mapped_type *ppBVar12;
  BranchInst *pBVar13;
  Argument *pAVar14;
  PHINode *pPVar15;
  Value *pVVar16;
  FunctionType *this_00;
  ret_type Ty;
  CallBase *pCVar17;
  Type *pTVar18;
  size_type sVar19;
  UnreachableInst *this_01;
  SwitchInst *pSVar20;
  _Base_ptr p_Var21;
  FunctionPass *pFVar22;
  long lVar23;
  char *__function;
  Function *pFVar24;
  pointer ppCVar25;
  Function *pFVar26;
  CallBase *pCVar27;
  char *__file;
  char *__assertion;
  Function *pFVar28;
  Function *pFVar29;
  iterator_range<llvm::Argument_*> iVar30;
  ArrayRef<llvm::Value_*> Args;
  BasicBlock *in_stack_fffffffffffffd68;
  Function *__range2;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> CallSites;
  BasicBlock *ParentBlock;
  Child local_250 [2];
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> CallArgs;
  Argument *local_200;
  Argument *A;
  map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToOrigParent;
  map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
  CallSiteToRet;
  
  cVar5 = llvm::Function::hasFnAttribute((AttrKind)F);
  if ((cVar5 != '\0') || (cVar5 = llvm::GlobalValue::isDeclaration(), cVar5 != '\0')) {
    return false;
  }
  CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar26 = Caller + 0x50;
  for (pFVar24 = pFVar26; pFVar24 = *(Function **)pFVar24, pFVar24 != Caller + 0x48;
      pFVar24 = pFVar24 + 8) {
    pFVar28 = pFVar24 + -0x18;
    if (pFVar24 == (Function *)0x0) {
      pFVar28 = (Function *)0x0;
    }
    for (pFVar29 = pFVar28 + 0x30; pFVar29 = *(Function **)pFVar29, pFVar29 != pFVar28 + 0x28;
        pFVar29 = pFVar29 + 8) {
      pFVar7 = pFVar29 + -0x18;
      if (pFVar29 == (Function *)0x0) {
        pFVar7 = (Function *)0x0;
      }
      CallSiteToRet._M_t._M_impl._0_8_ =
           llvm::dyn_cast<llvm::CallInst,llvm::Instruction>((Instruction *)pFVar7);
      if ((((CallBase *)CallSiteToRet._M_t._M_impl._0_8_ != (CallBase *)0x0) &&
          (bVar6 = llvm::CallBase::isInlineAsm((CallBase *)CallSiteToRet._M_t._M_impl._0_8_), !bVar6
          )) && (pFVar7 = llvm::CallBase::getCalledFunction
                                    ((CallBase *)CallSiteToRet._M_t._M_impl._0_8_), pFVar7 == F)) {
        std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::push_back
                  (&CallSites,(value_type *)&CallSiteToRet);
      }
    }
  }
  lVar23 = (long)CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  if (lVar23 == 0) {
    pCVar17 = (CallBase *)0x0;
  }
  else if (lVar23 == 1) {
    pCVar17 = &(*CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_CallBase;
  }
  else {
    CallArgs.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    CallArgs.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    CallArgs.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_header;
    CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         CallSiteToOrigParent._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pLVar8 = (LLVMContext *)llvm::Function::getContext();
    llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
    NameStr = (Twine *)llvm::BasicBlock::Create
                                 (pLVar8,(Twine *)&local_250[0].ptrAndLength,Caller,
                                  (BasicBlock *)0x0);
    ppCVar3 = CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar25 = CallSites.
                    super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppCVar25 != ppCVar3; ppCVar25 = ppCVar25 + 1)
    {
      pCVar17 = &(*ppCVar25)->super_CallBase;
      pBVar2 = *(BasicBlock **)&pCVar17->field_0x28;
      ParentBlock = pBVar2;
      pIVar9 = llvm::ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock>::getNextNode
                         ((ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock> *)
                          &pCVar17->field_0x18);
      llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
      pBVar10 = (mapped_type)llvm::BasicBlock::splitBasicBlock(pBVar2,pIVar9 + 0x18,local_250,0);
      pBVar2 = ParentBlock;
      local_250[0]._0_8_ = pCVar17;
      ppBVar11 = std::
                 map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                 ::operator[](&CallSiteToOrigParent,(key_type *)&local_250[0].twine);
      *ppBVar11 = pBVar2;
      ppBVar12 = std::
                 map<llvm::BasicBlock_*,_llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
                 ::operator[](&CallSiteToRet,&ParentBlock);
      *ppBVar12 = pBVar10;
      llvm::BasicBlock::getFirstNonPHI();
      llvm::Instruction::moveBefore(&pCVar17->super_Instruction);
      pBVar13 = llvm::BranchInst::Create((BasicBlock *)NameStr,ParentBlock);
      llvm::ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock>::getPrevNode
                ((ilist_node_with_parent<llvm::Instruction,_llvm::BasicBlock> *)(pBVar13 + 0x18));
      llvm::Instruction::eraseFromParent();
    }
    if (*(long *)(F + 0x60) != 0) {
      iVar30 = llvm::Function::args(F);
      uVar1 = 0;
      while( true ) {
        ppCVar25 = CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        ppCVar3 = CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_200 = iVar30.end_iterator;
        pAVar14 = iVar30.begin_iterator;
        if (pAVar14 == local_200) break;
        pTVar18 = *(Type **)pAVar14;
        llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
        pPVar15 = llvm::PHINode::Create
                            (pTVar18,(uint)((ulong)((long)ppCVar25 - (long)ppCVar3) >> 3),
                             (Twine *)&local_250[0].ptrAndLength,(BasicBlock *)NameStr);
        ppCVar3 = CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar25 = CallSites.
                        super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppCVar25 != ppCVar3;
            ppCVar25 = ppCVar25 + 1) {
          pCVar17 = &(*ppCVar25)->super_CallBase;
          pVVar16 = llvm::CallBase::getArgOperand(pCVar17,uVar1);
          local_250[0]._0_8_ = pCVar17;
          ppBVar11 = std::
                     map<llvm::Instruction_*,_llvm::BasicBlock_*,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
                     ::operator[](&CallSiteToOrigParent,(key_type *)&local_250[0].twine);
          llvm::PHINode::addIncoming(pPVar15,pVVar16,*ppBVar11);
        }
        local_250[0]._0_8_ = llvm::cast<llvm::Value,llvm::PHINode>(pPVar15);
        std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
                  ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)&CallArgs,
                   (Value **)&local_250[0].twine);
        uVar1 = uVar1 + 1;
        iVar30.end_iterator = local_200;
        iVar30.begin_iterator = pAVar14 + 0x28;
      }
    }
    this_00 = llvm::Function::getFunctionType(F);
    Ty = llvm::cast<llvm::Value,llvm::Function>(F);
    ppVVar4 = CallArgs.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    Func = CallArgs.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
    Args.Length = (size_type)local_250;
    Args.Data = (Value **)((long)ppVVar4 - (long)Func >> 3);
    pCVar17 = &llvm::CallInst::Create
                         ((CallInst *)this_00,(FunctionType *)Ty,(Value *)Func,Args,NameStr,
                          in_stack_fffffffffffffd68)->super_CallBase;
    ppCVar3 = CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar25 = CallSites.
                    super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppCVar25 != ppCVar3; ppCVar25 = ppCVar25 + 1)
    {
      llvm::Value::replaceAllUsesWith((Value *)*ppCVar25);
      llvm::Instruction::eraseFromParent();
    }
    pLVar8 = (LLVMContext *)llvm::Function::getContext();
    pTVar18 = (Type *)llvm::Type::getInt32Ty(pLVar8);
    ppCVar25 = CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppCVar3 = CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
    pPVar15 = llvm::PHINode::Create
                        (pTVar18,(uint)((ulong)((long)ppCVar25 - (long)ppCVar3) >> 3),
                         (Twine *)&local_250[0].ptrAndLength,&pCVar17->super_Instruction);
    for (; pFVar26 = *(Function **)pFVar26, pFVar26 != Caller + 0x48; pFVar26 = pFVar26 + 8) {
      pFVar24 = pFVar26 + -0x18;
      if (pFVar26 == (Function *)0x0) {
        pFVar24 = (Function *)0x0;
      }
      sVar19 = llvm::simple_ilist<llvm::Instruction>::size
                         ((simple_ilist<llvm::Instruction> *)(pFVar24 + 0x28));
      if (sVar19 == 1) {
        lVar23 = llvm::BasicBlock::getFirstNonPHI();
        if (lVar23 == 0) {
          __assertion = "instr && \"basic block contains no non-phi instructions\"";
          __file = 
          "/workspace/llm4binary/github/license_c_cmakelists/SheLLVM[P]SheLLVM/llvm/MergeCallsPass.h"
          ;
          __function = 
          "static BasicBlock *(anonymous namespace)::MergeCalls::getUnreachableBlock(Function *)";
          uVar1 = 0x1e;
          goto LAB_0012397e;
        }
        if (*(char *)(lVar23 + 0x10) == '\"') goto LAB_00123793;
      }
    }
    pLVar8 = (LLVMContext *)llvm::Function::getContext();
    llvm::Twine::Twine((Twine *)&local_250[0].ptrAndLength,"");
    pFVar24 = (Function *)
              llvm::BasicBlock::Create
                        (pLVar8,(Twine *)&local_250[0].ptrAndLength,Caller,(BasicBlock *)0x0);
    this_01 = (UnreachableInst *)llvm::UnreachableInst::operator_new(0x40);
    pLVar8 = (LLVMContext *)llvm::Function::getContext();
    llvm::UnreachableInst::UnreachableInst(this_01,pLVar8,(BasicBlock *)pFVar24);
LAB_00123793:
    pSVar20 = llvm::SwitchInst::Create
                        ((Value *)pPVar15,(BasicBlock *)pFVar24,
                         (uint)CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (BasicBlock *)NameStr);
    pCVar27 = (CallBase *)0x0;
    p_Var21 = CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var21 != &CallSiteToRet._M_t._M_impl.super__Rb_tree_header) {
      pLVar8 = (LLVMContext *)llvm::Function::getContext();
      local_250[0].ptrAndLength.length._0_4_ = 0x20;
      local_250[0]._0_8_ = pCVar27;
      llvm::APInt::clearUnusedBits((APInt *)&local_250[0].ptrAndLength);
      pVVar16 = (Value *)llvm::ConstantInt::get(pLVar8,(APInt *)&local_250[0].ptrAndLength);
      llvm::APInt::~APInt((APInt *)&local_250[0].ptrAndLength);
      llvm::PHINode::addIncoming(pPVar15,pVVar16,*(BasicBlock **)(p_Var21 + 1));
      llvm::SwitchInst::addCase((ConstantInt *)pSVar20,(BasicBlock *)pVVar16);
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
      pCVar27 = (CallBase *)&pCVar27->field_0x1;
    }
    std::
    _Rb_tree<llvm::Instruction_*,_std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::Instruction_*>,_std::allocator<std::pair<llvm::Instruction_*const,_llvm::BasicBlock_*>_>_>
    ::~_Rb_tree(&CallSiteToOrigParent._M_t);
    std::
    _Rb_tree<llvm::BasicBlock_*,_std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>,_std::_Select1st<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_llvm::BasicBlock_*>_>_>
    ::~_Rb_tree(&CallSiteToRet._M_t);
    std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base
              (&CallArgs.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>);
  }
  std::_Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::~_Vector_base
            (&CallSites.super__Vector_base<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>);
  if (pCVar17 != (CallBase *)0x0) {
    pFVar22 = this->reg2mem;
    if (pFVar22 == (FunctionPass *)0x0) {
      pFVar22 = (FunctionPass *)llvm::createDemoteRegisterToMemoryPass();
      this->reg2mem = pFVar22;
    }
    (**(code **)(*(long *)pFVar22 + 0x88))(pFVar22,Caller);
    CallSiteToRet._M_t._M_impl._0_8_ = 0;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    CallSiteToRet._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    lVar23 = llvm::InlineFunction
                       (pCVar17,(InlineFunctionInfo *)&CallSiteToRet,(AAResults *)0x0,true,
                        (Function *)0x0);
    if ((lVar23 == 0) && (cVar5 = llvm::Function::isDefTriviallyDead(), cVar5 != '\0')) {
      llvm::Function::eraseFromParent();
    }
    llvm::InlineFunctionInfo::~InlineFunctionInfo((InlineFunctionInfo *)&CallSiteToRet);
    return lVar23 == 0;
  }
  __assertion = "CallSite && \"MergeCalls did not return a unified callsite\"";
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/SheLLVM[P]SheLLVM/llvm/FlattenPass.cpp";
  __function = "bool Flatten::inlineFunction(Function *, Function *)";
  uVar1 = 0x23;
LAB_0012397e:
  __assert_fail(__assertion,__file,uVar1,__function);
}

Assistant:

bool Flatten::inlineFunction(Function *F, Function *Caller) {
  if (F->hasFnAttribute(Attribute::NoInline)) {
    // Function not eligible for inlining. Bail out.
    return false;
  }

  if (F->isDeclaration()) {
    // Function is declared, and not defined. Bail out.
    return false;
  }

  // First, run the MergeCalls pass on it:
  CallInst *CallSite = MergeCalls::mergeCallSites(Caller, F);
  assert(CallSite && "MergeCalls did not return a unified callsite");

  if (reg2mem == nullptr)
    reg2mem = llvm::createDemoteRegisterToMemoryPass();
  reg2mem->runOnFunction(*Caller);

  // Coerce LLVM to inline the function.
  InlineFunctionInfo IFI;
  if (!InlineFunction(cast<CallBase>(*CallSite), IFI).isSuccess()) {
    return false;
  }

  // If F is now completely dead, we can erase it from the module.
  if (F->isDefTriviallyDead()) {
    F->eraseFromParent();
  }

  return true;
}